

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O2

CSVOption<unsigned_long> duckdb::CSVOption<unsigned_long>::Deserialize(Deserializer *deserializer)

{
  undefined8 extraout_RAX;
  CSVOption<unsigned_long> CVar1;
  CSVOption<unsigned_long> result;
  
  result.set_by_user = false;
  Deserializer::ReadPropertyWithDefault<bool>(deserializer,100,"set_by_user",&result.set_by_user);
  Deserializer::ReadProperty<unsigned_long>(deserializer,0x65,"value",&result.value);
  CVar1._1_7_ = (undefined7)((ulong)extraout_RAX >> 8);
  CVar1.set_by_user = result.set_by_user;
  CVar1.value = result.value;
  return CVar1;
}

Assistant:

CSVOption<T> CSVOption<T>::Deserialize(Deserializer &deserializer) {
	CSVOption<T> result;
	deserializer.ReadPropertyWithDefault<bool>(100, "set_by_user", result.set_by_user);
	deserializer.ReadProperty<T>(101, "value", result.value);
	return result;
}